

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool anon_unknown.dwarf_392527::extract_tar(char *outFileName,bool verbose,bool extract)

{
  char *pcVar1;
  bool local_111;
  string local_b8;
  string local_98;
  string local_78;
  undefined4 local_58;
  wchar_t local_54;
  archive_entry *paStack_50;
  int r;
  archive_entry *entry;
  archive *ext;
  archive *local_30;
  archive *a;
  cmLocaleRAII localeRAII;
  bool extract_local;
  bool verbose_local;
  char *outFileName_local;
  
  localeRAII.OldLocale._6_1_ = extract;
  localeRAII.OldLocale._7_1_ = verbose;
  cmLocaleRAII::cmLocaleRAII((cmLocaleRAII *)&a);
  local_30 = archive_read_new();
  entry = (archive_entry *)archive_write_disk_new();
  archive_read_support_compression_all(local_30);
  archive_read_support_format_all(local_30);
  local_54 = cm_archive_read_open_file(local_30,outFileName,0x2800);
  if (local_54 == L'\0') {
    local_54 = L'\0';
    while (local_54 = archive_read_next_header(local_30,&stack0xffffffffffffffb0),
          local_54 != L'\x01') {
      if (local_54 != L'\0') {
        pcVar1 = archive_error_string(local_30);
        cmSystemTools::Error
                  ("Problem with archive_read_next_header(): ",pcVar1,(char *)0x0,(char *)0x0);
        break;
      }
      if ((localeRAII.OldLocale._7_1_ & 1) == 0) {
        if ((localeRAII.OldLocale._6_1_ & 1) == 0) {
          cm_archive_entry_pathname_abi_cxx11_(&local_98,paStack_50);
          pcVar1 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Stdout(pcVar1);
          std::__cxx11::string::~string((string *)&local_98);
          cmSystemTools::Stdout("\n");
        }
      }
      else {
        if ((localeRAII.OldLocale._6_1_ & 1) == 0) {
          list_item_verbose(_stdout,paStack_50);
        }
        else {
          cmSystemTools::Stdout("x ");
          cm_archive_entry_pathname_abi_cxx11_(&local_78,paStack_50);
          pcVar1 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Stdout(pcVar1);
          std::__cxx11::string::~string((string *)&local_78);
        }
        cmSystemTools::Stdout("\n");
      }
      if ((localeRAII.OldLocale._6_1_ & 1) != 0) {
        local_54 = archive_write_disk_set_options((archive *)entry,L'\x04');
        if (local_54 != L'\0') {
          pcVar1 = archive_error_string((archive *)entry);
          cmSystemTools::Error
                    ("Problem with archive_write_disk_set_options(): ",pcVar1,(char *)0x0,
                     (char *)0x0);
          break;
        }
        local_54 = archive_write_header((archive *)entry,paStack_50);
        if (local_54 != L'\0') {
          pcVar1 = archive_error_string((archive *)entry);
          cmSystemTools::Error
                    ("Problem with archive_write_header(): ",pcVar1,(char *)0x0,(char *)0x0);
          cm_archive_entry_pathname_abi_cxx11_(&local_b8,paStack_50);
          pcVar1 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error("Current file: ",pcVar1,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)&local_b8);
          break;
        }
        copy_data(local_30,(archive *)entry);
        local_54 = archive_write_finish_entry((archive *)entry);
        if (local_54 != L'\0') {
          pcVar1 = archive_error_string((archive *)entry);
          cmSystemTools::Error
                    ("Problem with archive_write_finish_entry(): ",pcVar1,(char *)0x0,(char *)0x0);
          break;
        }
        local_54 = L'\0';
      }
    }
    archive_write_free((archive *)entry);
    archive_read_close(local_30);
    archive_read_finish(local_30);
    local_111 = (uint)local_54 < 2;
    outFileName_local._7_1_ = local_111;
  }
  else {
    pcVar1 = archive_error_string(local_30);
    cmSystemTools::Error("Problem with archive_read_open_file(): ",pcVar1,(char *)0x0,(char *)0x0);
    archive_write_free((archive *)entry);
    archive_read_close(local_30);
    outFileName_local._7_1_ = false;
  }
  local_58 = 1;
  cmLocaleRAII::~cmLocaleRAII((cmLocaleRAII *)&a);
  return outFileName_local._7_1_;
}

Assistant:

bool extract_tar(const char* outFileName, bool verbose,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive *ext = archive_write_disk_new();
  archive_read_support_compression_all(a);
  archive_read_support_format_all(a);
  struct archive_entry *entry;
  int r = cm_archive_read_open_file(a, outFileName, 10240);
  if(r)
    {
    cmSystemTools::Error("Problem with archive_read_open_file(): ",
                         archive_error_string(a));
    archive_write_free(ext);
    archive_read_close(a);
    return false;
    }
  for (;;)
    {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF)
      {
      break;
      }
    if (r != ARCHIVE_OK)
      {
      cmSystemTools::Error("Problem with archive_read_next_header(): ",
                           archive_error_string(a));
      break;
      }
    if(verbose)
      {
      if(extract)
        {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
        }
      else
        {
        list_item_verbose(stdout, entry);
        }
      cmSystemTools::Stdout("\n");
      }
    else if(!extract)
      {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
      cmSystemTools::Stdout("\n");
      }
    if(extract)
      {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK)
        {
        cmSystemTools::Error(
          "Problem with archive_write_disk_set_options(): ",
          archive_error_string(ext));
        break;
        }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK)
        {
        copy_data(a, ext);
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK)
          {
          cmSystemTools::Error("Problem with archive_write_finish_entry(): ",
                               archive_error_string(ext));
          break;
          }
        }
#ifdef _WIN32
      else if(const char* linktext = archive_entry_symlink(entry))
        {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry)
                  << "\" -> \""
                  << linktext << "\"." << std::endl;
        }
#endif
      else
        {
        cmSystemTools::Error("Problem with archive_write_header(): ",
                             archive_error_string(ext));
        cmSystemTools::Error("Current file: ",
                             cm_archive_entry_pathname(entry).c_str());
        break;
        }
      }
    }